

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogBuffer.cpp
# Opt level: O0

void __thiscall
helics::LogBuffer::process
          (LogBuffer *this,
          function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
          *procFunc)

{
  basic_string_view<char,_std::char_traits<char>_> __args_2;
  bool bVar1;
  __tuple_element_t<0UL,_tuple<int,_basic_string<char,_char_traits<char>,_allocator<char>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>_>_>
  *p_Var2;
  _Deque_iterator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  *in_RSI;
  char *in_RDI;
  tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *logMessage;
  const_iterator __end1;
  const_iterator __begin1;
  deque<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  shared_handle block;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  _Deque_iterator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  *this_00;
  undefined4 in_stack_ffffffffffffff48;
  __tuple_element_t<0UL,_tuple<int,_basic_string<char,_char_traits<char>,_allocator<char>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>_>_>
  _Var3;
  basic_string_view<char,_std::char_traits<char>_> in_stack_ffffffffffffff58;
  _Self local_70;
  _Self local_50;
  deque<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_30;
  shared_lock_handle<std::deque<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::shared_timed_mutex>
  local_28;
  _Deque_iterator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  *local_10;
  
  local_10 = in_RSI;
  bVar1 = std::function::operator_cast_to_bool
                    ((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                      *)0x6bedf1);
  if (bVar1) {
    gmlc::libguarded::
    shared_guarded<std::deque<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::shared_timed_mutex>
    ::lock_shared((shared_guarded<std::deque<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::shared_timed_mutex>
                   *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    local_30 = gmlc::libguarded::
               shared_lock_handle<std::deque<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::shared_timed_mutex>
               ::operator*(&local_28);
    std::
    deque<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::begin((deque<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    std::
    deque<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::end((deque<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    while (bVar1 = std::operator==(&local_50,&local_70), ((bVar1 ^ 0xffU) & 1) != 0) {
      std::
      _Deque_iterator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
      ::operator*(&local_50);
      this_00 = local_10;
      p_Var2 = std::get<0ul,int,std::__cxx11::string,std::__cxx11::string>
                         ((tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)0x6bee85);
      _Var3 = *p_Var2;
      std::get<1ul,int,std::__cxx11::string,std::__cxx11::string>
                ((tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x6bee95);
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
      std::get<2ul,int,std::__cxx11::string,std::__cxx11::string>
                ((tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x6beeb1);
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
      __args_2._M_len._4_4_ = _Var3;
      __args_2._M_len._0_4_ = in_stack_ffffffffffffff48;
      __args_2._M_str = in_RDI;
      std::
      function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
      ::operator()((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                    *)this_00,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff58,__args_2);
      std::
      _Deque_iterator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
      ::operator++(this_00);
    }
    gmlc::libguarded::
    shared_lock_handle<std::deque<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::shared_timed_mutex>
    ::~shared_lock_handle
              ((shared_lock_handle<std::deque<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::shared_timed_mutex>
                *)0x6bef22);
  }
  return;
}

Assistant:

void LogBuffer::process(
    const std::function<void(int, std::string_view, std::string_view)>& procFunc) const
{
    if (!procFunc) {
        return;
    }
    auto block = mBuffer.lock_shared();
    for (const auto& logMessage : *block) {
        procFunc(std::get<0>(logMessage), std::get<1>(logMessage), std::get<2>(logMessage));
    }
}